

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrefcnt.cpp
# Opt level: O0

void __thiscall CVmWeakRefable::CVmWeakRefable(CVmWeakRefable *this)

{
  OS_Mutex *this_00;
  undefined8 *in_RDI;
  
  CVmRefCntObj::CVmRefCntObj((CVmRefCntObj *)0x32c9e7);
  *in_RDI = &PTR__CVmWeakRefable_003e8628;
  in_RDI[3] = 0;
  this_00 = (OS_Mutex *)operator_new(0x38);
  OS_Mutex::OS_Mutex(this_00);
  in_RDI[2] = this_00;
  return;
}

Assistant:

CVmWeakRefable::CVmWeakRefable()
{
    /* we don't have a weak ref yet */
    weakref = 0;

    /* create our mutex */
    mu = new OS_Mutex();
}